

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_models_md3.cpp
# Opt level: O0

void __thiscall
FMD3Model::RenderFrame
          (FMD3Model *this,FTexture *skin,int frameno,int frameno2,double inter,int translation)

{
  bool bVar1;
  MD3Surface *pMVar2;
  FMaterial *mat;
  FMaterial *tex;
  FTexture *local_40;
  FTexture *surfaceSkin;
  MD3Surface *surf;
  int i;
  int translation_local;
  double inter_local;
  int frameno2_local;
  int frameno_local;
  FTexture *skin_local;
  FMD3Model *this_local;
  
  if ((frameno < this->numFrames) && (frameno2 < this->numFrames)) {
    FRenderState::SetInterpolationFactor(&gl_RenderState,(float)inter);
    for (surf._0_4_ = 0; (int)surf < this->numSurfaces; surf._0_4_ = (int)surf + 1) {
      pMVar2 = this->surfaces + (int)surf;
      local_40 = skin;
      if (skin == (FTexture *)0x0) {
        bVar1 = FTextureID::isValid(((this->super_FModel).curSpriteMDLFrame)->surfaceskinIDs
                                    [(this->super_FModel).curMDLIndex] + (int)surf);
        if (bVar1) {
          local_40 = FTextureManager::operator()
                               (&TexMan,(FTextureID)
                                        ((this->super_FModel).curSpriteMDLFrame)->surfaceskinIDs
                                        [(this->super_FModel).curMDLIndex][(int)surf].texnum,false);
        }
        else if ((0 < pMVar2->numSkins) && (bVar1 = FTextureID::isValid(pMVar2->skins), bVar1)) {
          local_40 = FTextureManager::operator()(&TexMan,(FTextureID)pMVar2->skins->texnum,false);
        }
        if (local_40 == (FTexture *)0x0) {
          return;
        }
      }
      mat = FMaterial::ValidateTexture(local_40,false);
      FRenderState::SetMaterial(&gl_RenderState,mat,0,translation,-1,false);
      FRenderState::Apply(&gl_RenderState);
      FModelVertexBuffer::SetupFrame
                ((this->super_FModel).mVBuf,pMVar2->vindex + frameno * pMVar2->numVertices,
                 pMVar2->vindex + frameno2 * pMVar2->numVertices,pMVar2->numVertices);
      (*_ptrc_glDrawElements)
                (4,pMVar2->numTriangles * 3,0x1405,(void *)((ulong)pMVar2->iindex << 2));
    }
    FRenderState::SetInterpolationFactor(&gl_RenderState,0.0);
  }
  return;
}

Assistant:

void FMD3Model::RenderFrame(FTexture * skin, int frameno, int frameno2, double inter, int translation)
{
	if (frameno>=numFrames || frameno2>=numFrames) return;

	gl_RenderState.SetInterpolationFactor((float)inter);
	for(int i=0;i<numSurfaces;i++)
	{
		MD3Surface * surf = &surfaces[i];

		// [BB] In case no skin is specified via MODELDEF, check if the MD3 has a skin for the current surface.
		// Note: Each surface may have a different skin.
		FTexture *surfaceSkin = skin;
		if (!surfaceSkin)
		{
			if (curSpriteMDLFrame->surfaceskinIDs[curMDLIndex][i].isValid())
			{
				surfaceSkin = TexMan(curSpriteMDLFrame->surfaceskinIDs[curMDLIndex][i]);
			}
			else if(surf->numSkins > 0 && surf->skins[0].isValid())
			{
				surfaceSkin = TexMan(surf->skins[0]);
			}

			if (!surfaceSkin) return;
		}

		FMaterial * tex = FMaterial::ValidateTexture(surfaceSkin, false);

		gl_RenderState.SetMaterial(tex, CLAMP_NONE, translation, -1, false);

		gl_RenderState.Apply();
		mVBuf->SetupFrame(surf->vindex + frameno * surf->numVertices, surf->vindex + frameno2 * surf->numVertices, surf->numVertices);
		glDrawElements(GL_TRIANGLES, surf->numTriangles * 3, GL_UNSIGNED_INT, (void*)(intptr_t)(surf->iindex * sizeof(unsigned int)));
	}
	gl_RenderState.SetInterpolationFactor(0.f);
}